

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_dup_get_local_parent
                 (lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t options,
                 lyd_node **dup_parent,lyd_node **param_6)

{
  long lVar1;
  bool bVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  bool bVar5;
  lysc_node *local_b8;
  undefined8 local_a8;
  ly_ctx *local_98;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_70;
  ly_ctx *local_68;
  LY_ERR ret__;
  ly_bool ext_parent;
  ly_bool repeat;
  lyd_node *iter;
  lyd_node *orig_parent;
  lyd_node **local_parent_local;
  lyd_node **dup_parent_local;
  lyd_node *plStack_28;
  uint32_t options_local;
  lyd_node *parent_local;
  ly_ctx *trg_ctx_local;
  lyd_node *node_local;
  
  _ret__ = (lyd_node *)0x0;
  bVar2 = true;
  *dup_parent = (lyd_node *)0x0;
  *param_6 = (lyd_node *)0x0;
  bVar5 = (node->flags & 8) != 0;
  orig_parent = (lyd_node *)param_6;
  local_parent_local = dup_parent;
  dup_parent_local._4_4_ = options;
  plStack_28 = parent;
  parent_local = (lyd_node *)trg_ctx;
  trg_ctx_local = (ly_ctx *)node;
  iter = lyd_parent(node);
  do {
    if (!bVar2 || iter == (lyd_node *)0x0) {
      if ((bVar2) && (plStack_28 != (lyd_node *)0x0)) {
        if ((trg_ctx_local->dict).lock.__align == 0) {
          local_a8._0_4_ = (trg_ctx_local->list).size;
          local_a8._4_4_ = (trg_ctx_local->list).count;
        }
        else {
          local_a8 = *(undefined8 *)((trg_ctx_local->dict).lock.__align + 0x28);
        }
        if (plStack_28->schema == (lysc_node *)0x0) {
          local_b8 = plStack_28[1].schema;
        }
        else {
          local_b8 = (lysc_node *)plStack_28->schema->name;
        }
        ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINVAL,
               "None of the duplicated node \"%s\" schema parents match the provided parent \"%s\"."
               ,local_a8,local_b8);
        node_local._4_4_ = LY_EINVAL;
      }
      else {
        if ((*local_parent_local != (lyd_node *)0x0) && (plStack_28 != (lyd_node *)0x0)) {
          lyd_insert_node(plStack_28,(lyd_node **)0x0,*local_parent_local,0);
        }
        node_local._4_4_ = LY_SUCCESS;
      }
      return node_local._4_4_;
    }
    if (bVar5) {
      if (iter->schema == (lysc_node *)0x0) {
        local_68 = (ly_ctx *)iter[2].schema;
      }
      else {
        local_68 = iter->schema->module->ctx;
      }
      parent_local = (lyd_node *)local_68;
    }
    if (plStack_28 == (lyd_node *)0x0) {
LAB_00134fd2:
      if (plStack_28 != (lyd_node *)0x0) {
        if (plStack_28->schema == (lysc_node *)0x0) {
          local_88 = (ly_ctx *)plStack_28[2].schema;
        }
        else {
          local_88 = plStack_28->schema->module->ctx;
        }
        if (iter->schema == (lysc_node *)0x0) {
          local_98 = (ly_ctx *)iter[2].schema;
        }
        else {
          local_98 = iter->schema->module->ctx;
        }
        if (((local_88 != local_98) &&
            (lVar3 = lyd_compare_schema_equal(plStack_28->schema,iter->schema), lVar3 != '\0')) &&
           (lVar3 = lyd_compare_schema_parents_equal(plStack_28,iter), lVar3 != '\0')) {
          _ret__ = plStack_28;
          bVar2 = false;
          goto LAB_00135104;
        }
      }
      _ret__ = (lyd_node *)0x0;
      LVar4 = lyd_dup_r(iter,(ly_ctx *)parent_local,(lyd_node *)0x0,0,(lyd_node **)&ret__,
                        dup_parent_local._4_4_,(lyd_node **)&ret__);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (*local_parent_local != (lyd_node *)0x0) {
        lyd_insert_node(_ret__,(lyd_node **)0x0,*local_parent_local,0);
      }
      *local_parent_local = _ret__;
    }
    else {
      if (plStack_28->schema == (lysc_node *)0x0) {
        local_70 = (ly_ctx *)plStack_28[2].schema;
      }
      else {
        local_70 = plStack_28->schema->module->ctx;
      }
      if (iter->schema == (lysc_node *)0x0) {
        local_80 = (ly_ctx *)iter[2].schema;
      }
      else {
        local_80 = iter->schema->module->ctx;
      }
      if ((local_70 != local_80) || (plStack_28->schema != iter->schema)) goto LAB_00134fd2;
      _ret__ = plStack_28;
      bVar2 = false;
    }
LAB_00135104:
    lVar1._0_4_ = orig_parent->hash;
    lVar1._4_4_ = orig_parent->flags;
    if (lVar1 == 0) {
      *(lyd_node **)orig_parent = _ret__;
    }
    if ((iter->flags & 8) != 0) {
      bVar5 = true;
    }
    iter = lyd_parent(iter);
  } while( true );
}

Assistant:

static LY_ERR
lyd_dup_get_local_parent(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent,
        uint32_t options, struct lyd_node **dup_parent, struct lyd_node **local_parent)
{
    const struct lyd_node *orig_parent;
    struct lyd_node *iter = NULL;
    ly_bool repeat = 1, ext_parent = 0;

    *dup_parent = NULL;
    *local_parent = NULL;

    if (node->flags & LYD_EXT) {
        ext_parent = 1;
    }
    for (orig_parent = lyd_parent(node); repeat && orig_parent; orig_parent = lyd_parent(orig_parent)) {
        if (ext_parent) {
            /* use the standard context */
            trg_ctx = LYD_CTX(orig_parent);
        }
        if (parent && (LYD_CTX(parent) == LYD_CTX(orig_parent)) && (parent->schema == orig_parent->schema)) {
            /* stop creating parents, connect what we have into the provided parent */
            iter = parent;
            repeat = 0;
        } else if (parent && (LYD_CTX(parent) != LYD_CTX(orig_parent)) &&
                lyd_compare_schema_equal(parent->schema, orig_parent->schema) &&
                lyd_compare_schema_parents_equal(parent, orig_parent)) {
            iter = parent;
            repeat = 0;
        } else {
            iter = NULL;
            LY_CHECK_RET(lyd_dup_r(orig_parent, trg_ctx, NULL, LYD_INSERT_NODE_DEFAULT, &iter, options, &iter));

            /* insert into the previous duplicated parent */
            if (*dup_parent) {
                lyd_insert_node(iter, NULL, *dup_parent, LYD_INSERT_NODE_DEFAULT);
            }

            /* update the last duplicated parent */
            *dup_parent = iter;
        }

        /* set the first parent */
        if (!*local_parent) {
            *local_parent = iter;
        }

        if (orig_parent->flags & LYD_EXT) {
            ext_parent = 1;
        }
    }

    if (repeat && parent) {
        /* given parent and created parents chain actually do not interconnect */
        LOGERR(trg_ctx, LY_EINVAL, "None of the duplicated node \"%s\" schema parents match the provided parent \"%s\".",
                LYD_NAME(node), LYD_NAME(parent));
        return LY_EINVAL;
    }

    if (*dup_parent && parent) {
        /* last insert into a prevously-existing parent */
        lyd_insert_node(parent, NULL, *dup_parent, LYD_INSERT_NODE_DEFAULT);
    }
    return LY_SUCCESS;
}